

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O3

ssize_t __thiscall notch::io::CSVReader::read(CSVReader *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  uint uVar2;
  float *pfVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var4;
  long lVar5;
  ulong uVar6;
  undefined4 in_register_00000034;
  CSVReader *this_00;
  long lVar7;
  int in_R8D;
  long lVar8;
  int in_R9D;
  ulong uVar9;
  ulong uVar10;
  pointer __x;
  vector<float,_std::allocator<float>_> row;
  Input data;
  Output label;
  NumericTable numericRows;
  MixedTable mixedRows;
  TextTable rows;
  vector<float,_std::allocator<float>_> local_c0;
  LabeledDataset *local_a8;
  Input local_a0;
  Output local_90;
  vector<float,_std::allocator<float>_> *local_80;
  NumericTable local_78;
  MixedTable local_60;
  TextTable local_48;
  
  this_00 = (CSVReader *)CONCAT44(in_register_00000034,__fd);
  *(undefined8 *)(this + 3) = 0;
  this[3].inPtr = (istream *)0x0;
  *(undefined8 *)(this + 2) = 0;
  this[2].inPtr = (istream *)0x0;
  *(undefined8 *)(this + 1) = 0;
  this[1].inPtr = (istream *)0x0;
  *(undefined8 *)this = 0;
  this->inPtr = (istream *)0x0;
  *(undefined8 *)(this + 4) = 0;
  local_a8 = (LabeledDataset *)this;
  readCSV_abi_cxx11_(&local_48,this_00,(istream *)__buf,in_R8D,in_R9D);
  convertToMixed(&local_60,this_00,&local_48);
  convertToNumeric(&local_78,this_00,&local_60);
  local_80 = local_78.
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  __x = local_78.
        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  if (local_78.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      core::std::vector<float,_std::allocator<float>_>::vector(&local_c0,__x);
      uVar9 = *(long *)(__nbytes + 8) - *(long *)__nbytes;
      local_90._M_size = (long)uVar9 >> 2;
      pfVar3 = (float *)operator_new(uVar9);
      local_90._M_data = pfVar3;
      memset(pfVar3,0,uVar9);
      uVar10 = (long)local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
      uVar9 = (long)uVar10 >> 2;
      lVar5 = *(long *)__nbytes;
      lVar7 = *(long *)(__nbytes + 8) - lVar5;
      if (lVar7 != 0) {
        lVar7 = lVar7 >> 2;
        lVar8 = 0;
        do {
          pfVar3[lVar8] =
               local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[((long)*(int *)(lVar5 + lVar8 * 4) + uVar9) % uVar9]
          ;
          lVar8 = lVar8 + 1;
        } while (lVar7 + (ulong)(lVar7 == 0) != lVar8);
      }
      uVar2 = (int)uVar9 - 1;
      if (-1 < (int)uVar2) {
        uVar10 = (ulong)uVar2;
        uVar6 = uVar10 * 4 ^ 0xfffffffffffffffc;
        lVar5 = uVar10 * 4 + 4;
        lVar7 = uVar10 + 1;
        do {
          _Var4 = std::
                  __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_pred<notch::io::CSVReader::read(std::istream&,std::vector<int,std::allocator<int>>,int,int)::_lambda(int)_1_>>
                            (*(undefined8 *)__nbytes,*(undefined8 *)(__nbytes + 8),uVar9,
                             (int)lVar7 + -1);
          if (_Var4._M_current != *(int **)(__nbytes + 8)) {
            if ((pointer)((long)local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar5) !=
                local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              memmove(local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar7 + -1,
                      local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar7,
                      (long)local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish +
                      (uVar6 - (long)local_c0.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start));
            }
            local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1;
          }
          uVar6 = uVar6 + 4;
          lVar5 = lVar5 + -4;
          lVar8 = lVar7 + -1;
          bVar1 = 0 < lVar7;
          lVar7 = lVar8;
        } while (lVar8 != 0 && bVar1);
        uVar10 = (long)local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start;
        uVar9 = (long)uVar10 >> 2;
      }
      local_a0._M_size = uVar9;
      pfVar3 = (float *)operator_new(uVar10);
      local_a0._M_data = pfVar3;
      memset(pfVar3,0,uVar10);
      if ((long)local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        lVar5 = (long)local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2;
        lVar7 = 0;
        do {
          pfVar3[lVar7] =
               local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar5 + (ulong)(lVar5 == 0) != lVar7);
      }
      core::LabeledDataset::append(local_a8,&local_a0,&local_90);
      operator_delete(local_a0._M_data);
      operator_delete(local_90._M_data);
      if (local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      __x = __x + 1;
    } while (__x != local_80);
  }
  core::std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_78);
  core::std::
  vector<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>,_std::allocator<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>_>_>
  ::~vector(&local_60);
  core::std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_48);
  return (ssize_t)local_a8;
}

Assistant:

LabeledDataset
    read(std::istream &in, std::vector<int> labelcols = {-1},
         int skiprows=0, int skipcols=0) {
        LabeledDataset ds;
        auto rows = readCSV(in, skiprows, skipcols);
        auto mixedRows = convertToMixed(rows);
        auto numericRows = convertToNumeric(mixedRows);
        for (auto row : numericRows) {
            // build label vector
            Output label(labelcols.size());
            size_t ncols = row.size();
            for (size_t i = 0; i < labelcols.size(); ++i) {
                size_t colIdx = ((ncols + labelcols[i]) % ncols);
                label[i] = row[colIdx];
            }
            // remove label columns from the row (from the end)
            for (int i = row.size()-1; i >= 0; --i) {
                auto found = std::find_if(labelcols.begin(), labelcols.end(),
                             [=](int labelcol) {
                                return (labelcol + ncols) % ncols == size_t(i);
                             });
                if (found != labelcols.end()) {
                    row.erase(row.begin() + i);
                }
            }
            // build data vector
            Input data(row.size());
            for (size_t i = 0; i < row.size(); ++i) {
                data[i] = row[i];
            }
            ds.append(data, label);
        }
        return ds;
    }